

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  ExpressionSyntax *pEVar1;
  SyntaxNode *pSVar2;
  Type *this;
  bool bVar3;
  int iVar4;
  optional<int> oVar5;
  undefined4 extraout_var;
  Type *pTVar6;
  Diagnostic *this_00;
  char *func;
  uint7 in_register_00000011;
  _Storage<int,_true> _Var7;
  undefined4 uVar8;
  SourceRange SVar9;
  SequenceRange SVar10;
  _Storage<int,_true> local_48;
  _Storage<int,_true> _Stack_44;
  long local_38;
  
  local_48._M_value = 1;
  pEVar1 = (syntax->left).ptr;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    oVar5 = ASTContext::evalInteger(context,pEVar1,(bitmask<slang::ast::ASTFlags>)0x200000);
    pSVar2 = &((syntax->left).ptr)->super_SyntaxNode;
    if (pSVar2 != (SyntaxNode *)0x0) {
      SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
      bVar3 = ASTContext::requirePositive(context,oVar5,SVar9);
      _Var7._M_value =
           oVar5.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      if (bVar3) {
        local_48._M_value = _Var7._M_value;
      }
      pEVar1 = (syntax->right).ptr;
      if (pEVar1 != (ExpressionSyntax *)0x0) {
        iVar4 = Expression::bind((int)pEVar1,(sockaddr *)context,
                                 (uint)allowUnbounded << 0xb | 0x240000);
        this = (((Expression *)CONCAT44(extraout_var,iVar4))->type).ptr;
        if (this == (Type *)0x0) {
          func = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          goto LAB_0039dc1a;
        }
        pTVar6 = this->canonical;
        if (pTVar6 == (Type *)0x0) {
          Type::resolveCanonical(this);
          pTVar6 = this->canonical;
        }
        if ((pTVar6->super_Symbol).kind == UnboundedType) {
LAB_0039dbd7:
          uVar8 = 0;
LAB_0039dbd9:
          SVar10.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_44._M_value;
          SVar10.min = local_48._M_value;
          SVar10.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._4_4_ = uVar8;
          return SVar10;
        }
        oVar5 = ASTContext::evalInteger(context,(Expression *)CONCAT44(extraout_var,iVar4));
        pSVar2 = &((syntax->right).ptr)->super_SyntaxNode;
        if (pSVar2 != (SyntaxNode *)0x0) {
          SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
          bVar3 = ASTContext::requirePositive(context,oVar5,SVar9);
          if (!bVar3) goto LAB_0039dbd7;
          _Stack_44._M_value =
               oVar5.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_payload;
          uVar8 = (undefined4)CONCAT71(in_register_00000011 & 0xffffff,1);
          if (_Var7._M_value <= _Stack_44._M_value) goto LAB_0039dbd9;
          pSVar2 = &((syntax->left).ptr)->super_SyntaxNode;
          if (pSVar2 != (SyntaxNode *)0x0) {
            SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
            this_00 = ASTContext::addDiag(context,(DiagCode)0x400008,SVar9);
            pSVar2 = &((syntax->right).ptr)->super_SyntaxNode;
            if (pSVar2 != (SyntaxNode *)0x0) {
              SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
              Diagnostic::operator<<(this_00,SVar9);
              local_38 = (long)_Var7._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
              ::emplace_back<long>(&this_00->args,&local_38);
              local_38 = (long)_Stack_44._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
              ::emplace_back<long>(&this_00->args,&local_38);
              goto LAB_0039dbd9;
            }
          }
        }
      }
    }
  }
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_0039dc1a:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}